

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::
ImmutableEnumOneofFieldLiteGenerator
          (ImmutableEnumOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  
  ImmutableEnumFieldLiteGenerator::ImmutableEnumFieldLiteGenerator
            (&this->super_ImmutableEnumFieldLiteGenerator,descriptor,messageBitIndex,builderBitIndex
             ,context);
  (this->super_ImmutableEnumFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  _vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableEnumOneofFieldLiteGenerator_00429840;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x60));
  SetCommonOneofVariables(descriptor,info,&(this->super_ImmutableEnumFieldLiteGenerator).variables_)
  ;
  return;
}

Assistant:

ImmutableEnumOneofFieldLiteGenerator::
ImmutableEnumOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                 int messageBitIndex,
                                 int builderBitIndex,
                                 Context* context)
    : ImmutableEnumFieldLiteGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}